

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::mark_packable_structs(CompilerMSL *this)

{
  ParsedIR *this_00;
  uint id;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  SPIRVariable *var;
  SPIRType *type;
  long lVar4;
  LoopLock LStack_38;
  
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  lVar4 = 0;
  do {
    if (sVar2 << 2 == lVar4) {
      ParsedIR::LoopLock::~LoopLock(&LStack_38);
      return;
    }
    id = *(uint *)((long)&pTVar1->id + lVar4);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [id].type == TypeVariable) {
      var = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,id);
      if (var->storage != StorageClassFunction) {
        bVar3 = Compiler::is_hidden_variable((Compiler *)this,var,false);
        if (!bVar3) {
          type = Compiler::get<spirv_cross::SPIRType>
                           ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
          if (((type->pointer == true) &&
              (type->storage < (StorageClassStorageBuffer|StorageClassInput))) &&
             ((0x1205U >> (type->storage & 0x1f) & 1) != 0)) {
            bVar3 = Compiler::has_decoration
                              ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock);
            if (!bVar3) {
              bVar3 = Compiler::has_decoration
                                ((Compiler *)this,(ID)(type->super_IVariant).self.id,
                                 DecorationBufferBlock);
              if (!bVar3) goto LAB_0028a9fe;
            }
            mark_as_packable(this,type);
          }
        }
      }
    }
LAB_0028a9fe:
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

void CompilerMSL::mark_packable_structs()
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (var.storage != StorageClassFunction && !is_hidden_variable(var))
		{
			auto &type = this->get<SPIRType>(var.basetype);
			if (type.pointer &&
			    (type.storage == StorageClassUniform || type.storage == StorageClassUniformConstant ||
			     type.storage == StorageClassPushConstant || type.storage == StorageClassStorageBuffer) &&
			    (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock)))
				mark_as_packable(type);
		}
	});
}